

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bool filemgr_set_kv_header
               (filemgr *file,kvs_header *kv_header,_func_void_filemgr_ptr *free_kv_header)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  bool bVar1;
  bool ret;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  bVar1 = *(long *)(in_RDI + 0x170) == 0;
  if (bVar1) {
    *(undefined8 *)(in_RDI + 0x170) = in_RSI;
    *(undefined8 *)(in_RDI + 0x178) = in_RDX;
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  return bVar1;
}

Assistant:

bool filemgr_set_kv_header(struct filemgr *file, struct kvs_header *kv_header,
                           void (*free_kv_header)(struct filemgr *file))
{
    bool ret;
    spin_lock(&file->lock);

    if (!file->kv_header) {
        file->kv_header = kv_header;
        file->free_kv_header = free_kv_header;
        ret = true;
    } else {
        ret = false;
    }

    spin_unlock(&file->lock);

    return ret;
}